

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O3

Plausibility __thiscall
capnp::compiler::CompilerMain::isPlausiblyPacked
          (CompilerMain *this,ArrayPtr<const_unsigned_char> prefix,
          Function<capnp::compiler::CompilerMain::Plausibility_(kj::ArrayPtr<const_unsigned_char>)>
          *checkUnpacked)

{
  byte bVar1;
  byte bVar2;
  Iface *pIVar3;
  uchar *puVar4;
  RemoveConst<unsigned_char> *pRVar5;
  uchar *puVar6;
  Plausibility PVar7;
  byte *pbVar8;
  byte *pbVar9;
  size_t sVar10;
  ulong uVar11;
  byte *pbVar12;
  size_t sVar13;
  byte *pbVar14;
  uint uVar15;
  byte *pbVar16;
  Vector<unsigned_char> local_58;
  Function<capnp::compiler::CompilerMain::Plausibility_(kj::ArrayPtr<const_unsigned_char>)>
  *local_38;
  
  sVar10 = prefix.size_;
  pbVar16 = prefix.ptr;
  local_58.builder.ptr = (byte *)0x0;
  local_58.builder.pos = (byte *)0x0;
  local_58.builder.endPtr = (byte *)0x0;
  local_58.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  sVar13 = 0x400;
  if ((long)sVar10 < 0x400) {
    sVar13 = sVar10;
  }
  local_38 = checkUnpacked;
  if ((long)sVar10 < 1) {
    pbVar14 = (byte *)0x0;
  }
  else {
    pbVar12 = pbVar16 + sVar13;
    pbVar14 = (byte *)0x0;
    do {
      bVar1 = *pbVar16;
      pbVar16 = pbVar16 + 1;
      if (pbVar16 < pbVar12) {
        uVar15 = 0;
        do {
          if ((bVar1 >> (uVar15 & 0x1f) & 1) == 0) {
            if (pbVar14 == local_58.builder.endPtr) {
              sVar13 = ((long)pbVar14 - (long)local_58.builder.ptr) * 2;
              if (pbVar14 == local_58.builder.ptr) {
                sVar13 = 4;
              }
              kj::Vector<unsigned_char>::setCapacity(&local_58,sVar13);
              pbVar14 = local_58.builder.pos;
            }
            *pbVar14 = 0;
          }
          else {
            bVar2 = *pbVar16;
            if (bVar2 == 0) {
              PVar7 = IMPOSSIBLE;
              goto LAB_001203d2;
            }
            if (pbVar14 == local_58.builder.endPtr) {
              sVar13 = ((long)pbVar14 - (long)local_58.builder.ptr) * 2;
              if (pbVar14 == local_58.builder.ptr) {
                sVar13 = 4;
              }
              kj::Vector<unsigned_char>::setCapacity(&local_58,sVar13);
              pbVar14 = local_58.builder.pos;
            }
            pbVar16 = pbVar16 + 1;
            *pbVar14 = bVar2;
          }
          pbVar14 = local_58.builder.pos + 1;
          local_58.builder.pos = pbVar14;
        } while ((uVar15 < 7) && (uVar15 = uVar15 + 1, pbVar16 < pbVar12));
      }
      if (pbVar16 == pbVar12) break;
      if (bVar1 == 0xff) {
        pbVar8 = pbVar16 + 1;
        uVar11 = (long)pbVar12 - (long)pbVar8;
        if ((ulong)*pbVar16 << 3 <= uVar11) {
          uVar11 = (ulong)*pbVar16 << 3;
        }
        pbVar9 = pbVar14 + (uVar11 - (long)local_58.builder.ptr);
        if (local_58.builder.endPtr + -(long)local_58.builder.ptr < pbVar9) {
          pbVar14 = (byte *)((long)(local_58.builder.endPtr + -(long)local_58.builder.ptr) * 2);
          if (local_58.builder.endPtr == local_58.builder.ptr) {
            pbVar14 = (byte *)0x4;
          }
          if (pbVar14 < pbVar9) {
            pbVar14 = pbVar9;
          }
          kj::Vector<unsigned_char>::setCapacity(&local_58,(size_t)pbVar14);
          pbVar14 = local_58.builder.pos;
        }
        pbVar16 = pbVar16 + uVar11 + 1;
        pbVar9 = pbVar14;
        if (uVar11 != 0) {
          memcpy(pbVar14,pbVar8,uVar11);
          pbVar14 = pbVar14 + uVar11;
          pbVar9 = pbVar14;
        }
      }
      else {
        pbVar9 = local_58.builder.pos;
        if (bVar1 == 0) {
          bVar1 = *pbVar16;
          uVar11 = (ulong)((uint)bVar1 * 8);
          pbVar8 = pbVar14 + (uVar11 - (long)local_58.builder.ptr);
          if (local_58.builder.endPtr + -(long)local_58.builder.ptr < pbVar8) {
            pbVar14 = (byte *)((long)(local_58.builder.endPtr + -(long)local_58.builder.ptr) * 2);
            if (local_58.builder.endPtr == local_58.builder.ptr) {
              pbVar14 = (byte *)0x4;
            }
            if (pbVar14 < pbVar8) {
              pbVar14 = pbVar8;
            }
            kj::Vector<unsigned_char>::setCapacity(&local_58,(size_t)pbVar14);
            pbVar14 = local_58.builder.pos;
          }
          pbVar16 = pbVar16 + 1;
          pbVar9 = pbVar14;
          if (bVar1 != 0) {
            memset(pbVar14,0,uVar11);
            pbVar14 = pbVar14 + uVar11;
            pbVar9 = pbVar14;
          }
        }
      }
      local_58.builder.pos = pbVar9;
    } while (pbVar16 < pbVar12);
  }
  pIVar3 = (local_38->impl).ptr;
  PVar7 = (**pIVar3->_vptr_Iface)
                    (pIVar3,local_58.builder.ptr,(long)pbVar14 - (long)local_58.builder.ptr);
LAB_001203d2:
  puVar6 = local_58.builder.endPtr;
  pRVar5 = local_58.builder.pos;
  puVar4 = local_58.builder.ptr;
  if (local_58.builder.ptr != (byte *)0x0) {
    local_58.builder.ptr = (uchar *)0x0;
    local_58.builder.pos = (RemoveConst<unsigned_char> *)0x0;
    local_58.builder.endPtr = (uchar *)0x0;
    (**(local_58.builder.disposer)->_vptr_ArrayDisposer)
              (local_58.builder.disposer,puVar4,1,(long)pRVar5 - (long)puVar4,
               (long)puVar6 - (long)puVar4,0);
  }
  return PVar7;
}

Assistant:

Plausibility isPlausiblyPacked(kj::ArrayPtr<const byte> prefix,
      kj::Function<Plausibility(kj::ArrayPtr<const byte>)> checkUnpacked) {
    kj::Vector<byte> unpacked;

    // Try to unpack a prefix so that we can check it.
    const byte* pos = prefix.begin();
    const byte* end = prefix.end();
    if (end - pos > 1024) {
      // Don't bother unpacking more than 1k.
      end = pos + 1024;
    }
    while (pos < end) {
      byte tag = *pos++;
      for (uint i = 0; i < 8 && pos < end; i++) {
        if (tag & (1 << i)) {
          byte b = *pos++;
          if (b == 0) {
            // A zero byte should have been deflated away.
            return IMPOSSIBLE;
          }
          unpacked.add(b);
        } else {
          unpacked.add(0);
        }
      }

      if (pos == end) {
        break;
      }

      if (tag == 0) {
        uint count = *pos++ * 8;
        unpacked.addAll(kj::repeat(byte(0), count));
      } else if (tag == 0xff) {
        uint count = *pos++ * 8;
        size_t available = end - pos;
        uint n = kj::min(count, available);
        unpacked.addAll(pos, pos + n);
        pos += n;
      }
    }

    return checkUnpacked(unpacked);
  }